

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

void __thiscall RenX::Server::setUUIDFunction(Server *this,uuid_func func)

{
  _List_node_base *p_Var1;
  string_view uuid;
  string local_50;
  
  this->m_calc_uuid = func;
  p_Var1 = (this->players).super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var1 != (_List_node_base *)&this->players) {
    do {
      (*this->m_calc_uuid)(&local_50,(PlayerInfo *)(p_Var1 + 1));
      uuid._M_str = local_50._M_dataplus._M_p;
      uuid._M_len = local_50._M_string_length;
      setUUIDIfDifferent(this,(PlayerInfo *)(p_Var1 + 1),uuid);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      p_Var1 = p_Var1->_M_next;
    } while (p_Var1 != (_List_node_base *)&this->players);
  }
  return;
}

Assistant:

void RenX::Server::setUUIDFunction(RenX::Server::uuid_func func) {
	m_calc_uuid = func;

	for (auto node = this->players.begin(); node != this->players.end(); ++node) {
		setUUIDIfDifferent(*node, m_calc_uuid(*node));
	}
}